

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v1_decoder.cpp
# Opt level: O0

void __thiscall zmq::v1_decoder_t::~v1_decoder_t(v1_decoder_t *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_ESI;
  long in_RDI;
  char *errstr;
  int rc;
  decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator> *in_stack_ffffffffffffffd0;
  
  iVar1 = msg_t::close((msg_t *)(in_RDI + 0x48),in_ESI);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    in_stack_ffffffffffffffd0 =
         (decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator> *)&stderr;
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/v1_decoder.cpp"
            ,0x38);
    fflush((FILE *)(in_stack_ffffffffffffffd0->super_i_decoder)._vptr_i_decoder);
    zmq_abort((char *)0x31b063);
  }
  decoder_base_t<zmq::v1_decoder_t,_zmq::c_single_allocator>::~decoder_base_t
            (in_stack_ffffffffffffffd0);
  return;
}

Assistant:

zmq::v1_decoder_t::~v1_decoder_t ()
{
    const int rc = _in_progress.close ();
    errno_assert (rc == 0);
}